

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

void __thiscall QMakeEvaluator::applyExtraConfigs(QMakeEvaluator *this)

{
  bool bVar1;
  QStringBuilder<QString,_QString> *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QStringBuilder<QString,_QString> *this_00;
  QStringBuilder<QString,_QString> *a;
  QByteArrayView *in_stack_ffffffffffffff40;
  undefined1 local_b0 [8];
  QString *in_stack_ffffffffffffff58;
  QString *in_stack_ffffffffffffff60;
  QMakeEvaluator *in_stack_ffffffffffffff68;
  storage_type *local_78;
  undefined1 local_68 [96];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  a = in_RDI;
  bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x2fb564);
  if (!bVar1) {
    QByteArrayView::QByteArrayView<11ul>(in_stack_ffffffffffffff40,(char (*) [11])a);
    QVar2.m_data = local_78;
    QVar2.m_size = (qsizetype)local_68;
    QString::fromLatin1(QVar2);
    this_00 = (QStringBuilder<QString,_QString> *)&in_RDI[1].b.d.size;
    QLatin1Char::QLatin1Char((QLatin1Char *)&stack0xffffffffffffff6d,' ');
    QChar::QChar<QLatin1Char,_true>((QChar *)in_RDI,(QLatin1Char)(char)((ulong)a >> 0x38));
    ProStringList::join((ProStringList *)this_00,(QChar)(char16_t)((ulong)a >> 0x30));
    ::operator+(&a->a,&in_RDI->a);
    ::QStringBuilder::operator_cast_to_QString(this_00);
    QByteArrayView::QByteArrayView<16ul>(in_stack_ffffffffffffff40,(char (*) [16])a);
    QVar3.m_data = (storage_type *)in_stack_ffffffffffffff40;
    QVar3.m_size = (qsizetype)local_b0;
    QString::fromLatin1(QVar3);
    evaluateCommand(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    QString::~QString((QString *)0x2fb644);
    QString::~QString((QString *)0x2fb651);
    QStringBuilder<QString,_QString>::~QStringBuilder(in_RDI);
    QString::~QString((QString *)0x2fb668);
    QString::~QString((QString *)0x2fb672);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMakeEvaluator::applyExtraConfigs()
{
    if (m_extraConfigs.isEmpty())
        return;

    evaluateCommand(fL1S("CONFIG += ") + m_extraConfigs.join(QLatin1Char(' ')), fL1S("(extra configs)"));
}